

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

boolean encode_mcu_AC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  huff_entropy_ptr entropy;
  jpeg_destination_mgr *pjVar4;
  int *piVar5;
  JBLOCKROW paJVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ushort uVar11;
  char *bufstart;
  int symbol;
  int iVar12;
  ulong uVar13;
  int absvalues [64];
  
  entropy = (huff_entropy_ptr)cinfo->entropy;
  pjVar4 = cinfo->dest;
  entropy->next_output_byte = pjVar4->next_output_byte;
  entropy->free_in_buffer = pjVar4->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy->restarts_to_go == 0)) {
    emit_restart_e(entropy,entropy->next_restart_num);
  }
  iVar2 = cinfo->Se;
  iVar12 = cinfo->Al;
  piVar5 = cinfo->natural_order;
  paJVar6 = *MCU_data;
  uVar8 = 0;
  uVar13 = (ulong)cinfo->Ss;
  for (uVar9 = uVar13; (long)uVar9 <= (long)iVar2; uVar9 = uVar9 + 1) {
    uVar1 = (*paJVar6)[piVar5[uVar9]];
    uVar11 = -uVar1;
    if (0 < (short)uVar1) {
      uVar11 = uVar1;
    }
    uVar10 = (uint)(uVar11 >> ((byte)iVar12 & 0x1f));
    absvalues[uVar9] = uVar10;
    if (uVar10 == 1) {
      uVar8 = uVar9 & 0xffffffff;
    }
  }
  bufstart = entropy->bit_buffer + entropy->BE;
  uVar10 = 0;
  iVar12 = 0;
  for (; (long)uVar13 <= (long)iVar2; uVar13 = uVar13 + 1) {
    iVar3 = absvalues[uVar13];
    if (iVar3 == 0) {
      iVar12 = iVar12 + 1;
    }
    else {
      symbol = iVar12 * 0x10 + 1;
      while ((0xf < iVar12 && ((long)uVar13 <= (long)(int)uVar8))) {
        emit_eobrun(entropy);
        emit_ac_symbol(entropy,entropy->ac_tbl_no,0xf0);
        iVar12 = iVar12 + -0x10;
        emit_buffered_bits(entropy,bufstart,uVar10);
        bufstart = entropy->bit_buffer;
        symbol = symbol + -0x100;
        uVar10 = 0;
      }
      if (iVar3 < 2) {
        emit_eobrun(entropy);
        emit_ac_symbol(entropy,entropy->ac_tbl_no,symbol);
        emit_bits_e(entropy,(uint)(-1 < (*paJVar6)[piVar5[uVar13]]),1);
        emit_buffered_bits(entropy,bufstart,uVar10);
        bufstart = entropy->bit_buffer;
        uVar10 = 0;
        iVar12 = 0;
      }
      else {
        uVar9 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
        bufstart[uVar9] = (byte)iVar3 & 1;
      }
    }
  }
  if (uVar10 != 0 || 0 < iVar12) {
    uVar7 = entropy->EOBRUN + 1;
    entropy->EOBRUN = uVar7;
    uVar10 = uVar10 + entropy->BE;
    entropy->BE = uVar10;
    if ((uVar7 == 0x7fff) || (0x3a9 < uVar10)) {
      emit_eobrun(entropy);
    }
  }
  pjVar4 = cinfo->dest;
  pjVar4->next_output_byte = entropy->next_output_byte;
  pjVar4->free_in_buffer = entropy->free_in_buffer;
  uVar10 = cinfo->restart_interval;
  if (uVar10 != 0) {
    uVar7 = entropy->restarts_to_go;
    if (entropy->restarts_to_go == 0) {
      entropy->next_restart_num = entropy->next_restart_num + 1U & 7;
      uVar7 = uVar10;
    }
    entropy->restarts_to_go = uVar7 - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_refine (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int temp;
  register int r, k;
  int EOB;
  char *BR_buffer;
  unsigned int BR;
  int Se, Al;
  const int * natural_order;
  JBLOCKROW block;
  int absvalues[DCTSIZE2];

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart_e(entropy, entropy->next_restart_num);

  Se = cinfo->Se;
  Al = cinfo->Al;
  natural_order = cinfo->natural_order;

  /* Encode the MCU data block */
  block = MCU_data[0];

  /* It is convenient to make a pre-pass to determine the transformed
   * coefficients' absolute values and the EOB position.
   */
  EOB = 0;
  for (k = cinfo->Ss; k <= Se; k++) {
    temp = (*block)[natural_order[k]];
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if (temp < 0)
      temp = -temp;		/* temp is abs value of input */
    temp >>= Al;		/* apply the point transform */
    absvalues[k] = temp;	/* save abs value for main pass */
    if (temp == 1)
      EOB = k;			/* EOB = index of last newly-nonzero coef */
  }

  /* Encode the AC coefficients per section G.1.2.3, fig. G.7 */
  
  r = 0;			/* r = run length of zeros */
  BR = 0;			/* BR = count of buffered bits added now */
  BR_buffer = entropy->bit_buffer + entropy->BE; /* Append bits to buffer */

  for (k = cinfo->Ss; k <= Se; k++) {
    if ((temp = absvalues[k]) == 0) {
      r++;
      continue;
    }

    /* Emit any required ZRLs, but not if they can be folded into EOB */
    while (r > 15 && k <= EOB) {
      /* emit any pending EOBRUN and the BE correction bits */
      emit_eobrun(entropy);
      /* Emit ZRL */
      emit_ac_symbol(entropy, entropy->ac_tbl_no, 0xF0);
      r -= 16;
      /* Emit buffered correction bits that must be associated with ZRL */
      emit_buffered_bits(entropy, BR_buffer, BR);
      BR_buffer = entropy->bit_buffer; /* BE bits are gone now */
      BR = 0;
    }

    /* If the coef was previously nonzero, it only needs a correction bit.
     * NOTE: a straight translation of the spec's figure G.7 would suggest
     * that we also need to test r > 15.  But if r > 15, we can only get here
     * if k > EOB, which implies that this coefficient is not 1.
     */
    if (temp > 1) {
      /* The correction bit is the next bit of the absolute value. */
      BR_buffer[BR++] = (char) (temp & 1);
      continue;
    }

    /* Emit any pending EOBRUN and the BE correction bits */
    emit_eobrun(entropy);

    /* Count/emit Huffman symbol for run length / number of bits */
    emit_ac_symbol(entropy, entropy->ac_tbl_no, (r << 4) + 1);

    /* Emit output bit for newly-nonzero coef */
    temp = ((*block)[natural_order[k]] < 0) ? 0 : 1;
    emit_bits_e(entropy, (unsigned int) temp, 1);

    /* Emit buffered correction bits that must be associated with this code */
    emit_buffered_bits(entropy, BR_buffer, BR);
    BR_buffer = entropy->bit_buffer; /* BE bits are gone now */
    BR = 0;
    r = 0;			/* reset zero run length */
  }

  if (r > 0 || BR > 0) {	/* If there are trailing zeroes, */
    entropy->EOBRUN++;		/* count an EOB */
    entropy->BE += BR;		/* concat my correction bits to older ones */
    /* We force out the EOB if we risk either:
     * 1. overflow of the EOB counter;
     * 2. overflow of the correction bit buffer during the next MCU.
     */
    if (entropy->EOBRUN == 0x7FFF || entropy->BE > (MAX_CORR_BITS-DCTSIZE2+1))
      emit_eobrun(entropy);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}